

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

void __thiscall GlobOpt::ValueNumberObjectType(GlobOpt *this,Opnd *dstOpnd,Instr *instr)

{
  OpCode OVar1;
  Opnd *this_00;
  Func *this_01;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  BailOutKind BVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  RegOpnd *pRVar7;
  JITTimeConstructorCache *this_04;
  StackSym *pSVar8;
  Value *pVVar9;
  JITTypeHolder type;
  
  OVar3 = IR::Opnd::GetKind(dstOpnd);
  if (OVar3 != OpndKindReg) {
    return;
  }
  OVar3 = IR::Opnd::GetKind(dstOpnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_004a3d17;
    *puVar6 = 0;
  }
  if ((*(byte *)((long)dstOpnd[1]._vptr_Opnd + 0x1a) & 1) != 0) {
    return;
  }
  OVar1 = instr->m_opcode;
  if ((OVar1 == NewScObjectNoCtor) || (OVar1 == NewScObject)) {
    this_02 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_02);
    this_03 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,ObjTypeSpecNewObjPhase,sourceContextId,functionId);
    if ((bVar4) && ((instr->field_0x38 & 0x10) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x683,
                         "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::ObjTypeSpecNewObjPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())) || !instr->HasBailOutInfo())"
                         ,
                         "!PHASE_OFF(Js::ObjTypeSpecNewObjPhase, this->func) || !instr->HasBailOutInfo()"
                        );
      if (!bVar4) goto LAB_004a3d17;
      *puVar6 = 0;
    }
    if ((instr->field_0x38 & 0x10) == 0) {
      return;
    }
    if (instr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x687,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
      if (!bVar4) goto LAB_004a3d17;
      *puVar6 = 0;
    }
    BVar5 = IR::Instr::GetBailOutKind(instr);
    if (BVar5 != BailOutFailedCtorGuardCheck) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x688,"(instr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck)",
                         "instr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck");
      if (!bVar4) goto LAB_004a3d17;
      *puVar6 = 0;
    }
    OVar1 = instr->m_opcode;
    this_01 = instr->m_func;
    if (instr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar4) goto LAB_004a3d17;
      *puVar6 = 0;
    }
    this_04 = Func::GetConstructorCache(this_01,*(ProfileId *)&instr[1]._vptr_Instr);
    if ((this_04 == (JITTimeConstructorCache *)0x0) ||
       ((OVar1 != NewScObjectNoCtor &&
        (bVar4 = JITTimeConstructorCache::IsTypeFinal(this_04), !bVar4)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x68c,
                         "(ctorCache != nullptr && (isCtorInlined || ctorCache->IsTypeFinal()))",
                         "ctorCache != nullptr && (isCtorInlined || ctorCache->IsTypeFinal())");
      if (!bVar4) goto LAB_004a3d17;
      *puVar6 = 0;
    }
    OVar3 = IR::Opnd::GetKind(dstOpnd);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_004a3d17;
      *puVar6 = 0;
    }
    pSVar8 = EnsureObjectTypeSym(this,(StackSym *)dstOpnd[1]._vptr_Opnd);
    pVVar9 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSVar8->super_Sym);
    if (pVVar9 == (Value *)0x0) {
LAB_004a3a7d:
      type = JITTimeConstructorCache::GetType(this_04);
      SetObjectTypeFromTypeSym
                (this,pSVar8,type,(EquivalentTypeSet *)0x0,&this->currentBlock->globOptData,false);
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x690,"(this->currentBlock->globOptData.FindValue(dstTypeSym) == nullptr)",
                       "this->currentBlock->globOptData.FindValue(dstTypeSym) == nullptr");
    if (bVar4) {
      *puVar6 = 0;
      goto LAB_004a3a7d;
    }
    goto LAB_004a3d17;
  }
  if (OVar1 == Ld_A) {
    this_00 = instr->m_src1;
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) goto LAB_004a3ab0;
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_004a3d17;
      *puVar6 = 0;
    }
    if ((*(byte *)((long)this_00[1]._vptr_Opnd + 0x1a) & 1) != 0) goto LAB_004a3ab0;
    pRVar7 = IR::Opnd::AsRegOpnd(this_00);
    bVar4 = StackSym::HasObjectTypeSym(pRVar7->m_sym);
    if (!bVar4) goto LAB_004a3ab0;
    pRVar7 = IR::Opnd::AsRegOpnd(this_00);
    pSVar8 = StackSym::GetObjectTypeSym(pRVar7->m_sym);
    pVVar9 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSVar8->super_Sym);
  }
  else {
LAB_004a3ab0:
    pVVar9 = (Value *)0x0;
  }
  if (pVVar9 == (Value *)0x0) {
    OVar3 = IR::Opnd::GetKind(dstOpnd);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_004a3d17;
      *puVar6 = 0;
    }
    bVar4 = StackSym::HasObjectTypeSym((StackSym *)dstOpnd[1]._vptr_Opnd);
    if (!bVar4) {
      return;
    }
    OVar3 = IR::Opnd::GetKind(dstOpnd);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_004a3d17;
      *puVar6 = 0;
    }
    pSVar8 = StackSym::GetObjectTypeSym((StackSym *)dstOpnd[1]._vptr_Opnd);
    GlobOptBlockData::ClearSymValue(&this->currentBlock->globOptData,&pSVar8->super_Sym);
    return;
  }
  bVar4 = ValueInfo::IsJsType(pVVar9->valueInfo);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x6af,"(newValue->GetValueInfo()->IsJsType())",
                       "newValue->GetValueInfo()->IsJsType()");
    if (!bVar4) goto LAB_004a3d17;
    *puVar6 = 0;
  }
  OVar3 = IR::Opnd::GetKind(dstOpnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_004a3d17;
    *puVar6 = 0;
  }
  StackSym::HasObjectTypeSym((StackSym *)dstOpnd[1]._vptr_Opnd);
  OVar3 = IR::Opnd::GetKind(dstOpnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) {
LAB_004a3d17:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pSVar8 = EnsureObjectTypeSym(this,(StackSym *)dstOpnd[1]._vptr_Opnd);
  GlobOptBlockData::SetValue(&this->currentBlock->globOptData,pVVar9,&pSVar8->super_Sym);
  return;
}

Assistant:

void
GlobOpt::ValueNumberObjectType(IR::Opnd *dstOpnd, IR::Instr *instr)
{
    if (!dstOpnd->IsRegOpnd())
    {
        return;
    }

    if (dstOpnd->AsRegOpnd()->m_sym->IsTypeSpec())
    {
        return;
    }

    if (instr->IsNewScObjectInstr())
    {
        // If we have a NewScObj* for which we have a valid constructor cache we know what type the created object will have.
        // Let's produce the type value accordingly so we don't insert a type check and bailout in the constructor and
        // potentially further downstream.
        Assert(!PHASE_OFF(Js::ObjTypeSpecNewObjPhase, this->func) || !instr->HasBailOutInfo());

        if (instr->HasBailOutInfo())
        {
            Assert(instr->IsProfiledInstr());
            Assert(instr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck);

            bool isCtorInlined = instr->m_opcode == Js::OpCode::NewScObjectNoCtor;
            JITTimeConstructorCache * ctorCache = instr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId));
            Assert(ctorCache != nullptr && (isCtorInlined || ctorCache->IsTypeFinal()));

            StackSym* objSym = dstOpnd->AsRegOpnd()->m_sym;
            StackSym* dstTypeSym = EnsureObjectTypeSym(objSym);
            Assert(this->currentBlock->globOptData.FindValue(dstTypeSym) == nullptr);

            SetObjectTypeFromTypeSym(dstTypeSym, ctorCache->GetType(), nullptr);
        }
    }
    else
    {
        // If the dst opnd is a reg that has a type sym associated with it, then we are either killing
        // the type's existing value or (in the case of a reg copy) assigning it the value of
        // the src's type sym (if any). If the dst doesn't have a type sym, but the src does, let's
        // give dst a new type sym and transfer the value.
        Value *newValue = nullptr;
        IR::Opnd * srcOpnd = instr->GetSrc1();

        if (instr->m_opcode == Js::OpCode::Ld_A && srcOpnd->IsRegOpnd() &&
            !srcOpnd->AsRegOpnd()->m_sym->IsTypeSpec() && srcOpnd->AsRegOpnd()->m_sym->HasObjectTypeSym())
        {
            StackSym *srcTypeSym = srcOpnd->AsRegOpnd()->m_sym->GetObjectTypeSym();
            newValue = this->currentBlock->globOptData.FindValue(srcTypeSym);
        }

        if (newValue == nullptr)
        {
            if (dstOpnd->AsRegOpnd()->m_sym->HasObjectTypeSym())
            {
                StackSym * typeSym = dstOpnd->AsRegOpnd()->m_sym->GetObjectTypeSym();
                this->currentBlock->globOptData.ClearSymValue(typeSym);
            }
        }
        else
        {
            Assert(newValue->GetValueInfo()->IsJsType());
            StackSym * typeSym;
            if (!dstOpnd->AsRegOpnd()->m_sym->HasObjectTypeSym())
            {
                typeSym = nullptr;
            }
            typeSym = EnsureObjectTypeSym(dstOpnd->AsRegOpnd()->m_sym);
            this->currentBlock->globOptData.SetValue(newValue, typeSym);
        }
    }
}